

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v7::detail::
     value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
     format_custom_arg<diy::Point<float,3u>,fmt::v7::detail::fallback_formatter<diy::Point<float,3u>,char,void>>
               (void *arg,parse_context_type *parse_ctx,
               basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx)

{
  buffer_appender<char> it;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *in_RDX;
  fallback_formatter<diy::Point<float,_3U>,_char,_void> *in_RSI;
  fallback_formatter<diy::Point<float,_3U>,_char,_void> f;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *in_stack_00000208;
  Point<float,_3U> *in_stack_00000210;
  fallback_formatter<diy::Point<float,_3U>,_char,_void> *in_stack_00000218;
  basic_format_parse_context<char,_fmt::v7::detail::error_handler> *in_stack_ffffffffffffff88;
  iterator in_stack_ffffffffffffff98;
  basic_format_parse_context<char,_fmt::v7::detail::error_handler> *in_stack_ffffffffffffffa0;
  
  fallback_formatter<diy::Point<float,_3U>,_char,_void>::fallback_formatter
            ((fallback_formatter<diy::Point<float,_3U>,_char,_void> *)0x20787d);
  fallback_formatter<diy::Point<float,_3U>,_char,_void>::parse(in_RSI,in_stack_ffffffffffffff88);
  basic_format_parse_context<char,_fmt::v7::detail::error_handler>::advance_to
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  it = fallback_formatter<diy::Point<float,3u>,char,void>::
       format<fmt::v7::detail::buffer_appender<char>>
                 (in_stack_00000218,in_stack_00000210,in_stack_00000208);
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::advance_to
            (in_RDX,(iterator)
                    it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
  return;
}

Assistant:

static void format_custom_arg(const void* arg,
                                typename Context::parse_context_type& parse_ctx,
                                Context& ctx) {
    Formatter f;
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }